

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O2

NodesSeq<dg::dda::RWNode> * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createCall
          (NodesSeq<dg::dda::RWNode> *__return_storage_ptr__,LLVMReadWriteGraphBuilder *this,
          Instruction *Inst)

{
  Value *calledValue;
  raw_ostream *prVar1;
  initializer_list<dg::dda::RWNode_*> local_58;
  _Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_48;
  RWNode *local_28;
  
  calledValue = (Value *)llvm::Value::stripPointerCasts();
  if (*(char *)(*(long *)(Inst + -0x20) + 0x10) == '\x17') {
    if (createCall(llvm::Instruction_const*)::warned_inline_assembly == '\0') {
      prVar1 = (raw_ostream *)llvm::errs();
      llvm::raw_ostream::operator<<(prVar1,"[RWG] WARNING: Inline assembler found\n");
      createCall(llvm::Instruction_const*)::warned_inline_assembly = '\x01';
    }
    local_58._M_array = (iterator)createUnknownCall(this,(CallInst *)Inst);
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)&local_58;
    NodesSeq<dg::dda::RWNode>::NodesSeq
              (__return_storage_ptr__,(initializer_list<dg::dda::RWNode_*> *)&local_48);
  }
  else {
    if ((calledValue == (Value *)0x0) || (calledValue[0x10] != (Value)0x0)) {
      getCalledFunctions((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                         &local_48,calledValue,this->PTA);
      if (local_48._M_impl.super__Vector_impl_data._M_start ==
          local_48._M_impl.super__Vector_impl_data._M_finish) {
        prVar1 = (raw_ostream *)llvm::errs();
        prVar1 = llvm::raw_ostream::operator<<
                           (prVar1,
                            "[RWG] error: could not determine the called function in a call via pointer: \n"
                           );
        local_58._M_array = (iterator)Inst;
        prVar1 = operator<<(prVar1,(ValInfo *)&local_58);
        llvm::raw_ostream::operator<<(prVar1,"\n");
        local_28 = createUnknownCall(this,(CallInst *)Inst);
        local_58._M_array = &local_28;
        local_58._M_len = 1;
        NodesSeq<dg::dda::RWNode>::NodesSeq(__return_storage_ptr__,&local_58);
      }
      else {
        createCallToFunctions
                  (__return_storage_ptr__,this,
                   (vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                   &local_48,(CallInst *)Inst);
      }
    }
    else {
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58._M_array = (iterator)calledValue;
      std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
      _M_range_initialize<llvm::Function_const*const*>
                ((vector<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)&local_48,
                 &local_58);
      createCallToFunctions
                (__return_storage_ptr__,this,
                 (vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                 &local_48,(CallInst *)Inst);
    }
    std::_Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::
    ~_Vector_base(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

NodesSeq<RWNode>
LLVMReadWriteGraphBuilder::createCall(const llvm::Instruction *Inst) {
    using namespace llvm;
    const CallInst *CInst = cast<CallInst>(Inst);
#if LLVM_VERSION_MAJOR >= 8
    const Value *calledVal = CInst->getCalledOperand()->stripPointerCasts();
#else
    const Value *calledVal = CInst->getCalledValue()->stripPointerCasts();
#endif
    static bool warned_inline_assembly = false;

    if (CInst->isInlineAsm()) {
        if (!warned_inline_assembly) {
            llvm::errs() << "[RWG] WARNING: Inline assembler found\n";
            warned_inline_assembly = true;
        }
        return {createUnknownCall(CInst)};
    }

    if (const Function *function = dyn_cast<Function>(calledVal)) {
        return createCallToFunctions({function}, CInst);
    }

    const auto &functions = getCalledFunctions(calledVal, PTA);
    if (functions.empty()) {
        llvm::errs() << "[RWG] error: could not determine the called function "
                        "in a call via pointer: \n"
                     << ValInfo(CInst) << "\n";
        return {createUnknownCall(CInst)};
    }
    return createCallToFunctions(functions, CInst);
}